

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O1

bool __thiscall cmNinjaTargetGenerator::NeedDepTypeMSVC(cmNinjaTargetGenerator *this,string *lang)

{
  cmMakefile *this_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  bool bVar6;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  iVar3 = std::__cxx11::string::compare((char *)lang);
  if ((iVar3 != 0) && (iVar3 = std::__cxx11::string::compare((char *)lang), iVar3 != 0)) {
    return false;
  }
  this_00 = this->Makefile;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"CMAKE_C_COMPILER_ID","");
  pcVar5 = cmMakefile::GetSafeDefinition(this_00,&local_50);
  iVar3 = strcmp(pcVar5,"MSVC");
  bVar6 = true;
  if (iVar3 != 0) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"CMAKE_CXX_COMPILER_ID","");
    pcVar5 = cmMakefile::GetSafeDefinition(this_00,&local_70);
    iVar4 = strcmp(pcVar5,"MSVC");
    if (iVar4 != 0) {
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"CMAKE_C_SIMULATE_ID","");
      pcVar5 = cmMakefile::GetSafeDefinition(this_00,&local_90);
      iVar4 = strcmp(pcVar5,"MSVC");
      if (iVar4 == 0) {
        bVar2 = true;
        bVar1 = false;
        bVar6 = true;
      }
      else {
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b0,"CMAKE_CXX_SIMULATE_ID","");
        pcVar5 = cmMakefile::GetSafeDefinition(this_00,&local_b0);
        iVar4 = strcmp(pcVar5,"MSVC");
        bVar6 = iVar4 == 0;
        bVar2 = true;
        bVar1 = true;
      }
      goto LAB_00253a13;
    }
  }
  bVar2 = false;
  bVar1 = false;
LAB_00253a13:
  if ((bVar1) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2)) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((bVar2) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2)) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((iVar3 != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2)) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return bVar6;
}

Assistant:

bool cmNinjaTargetGenerator::NeedDepTypeMSVC(const std::string& lang) const
{
  if (lang == "C" || lang == "CXX")
    {
    cmMakefile* mf = this->GetMakefile();
    return (
      strcmp(mf->GetSafeDefinition("CMAKE_C_COMPILER_ID"), "MSVC") == 0 ||
      strcmp(mf->GetSafeDefinition("CMAKE_CXX_COMPILER_ID"), "MSVC") == 0 ||
      strcmp(mf->GetSafeDefinition("CMAKE_C_SIMULATE_ID"), "MSVC") == 0 ||
      strcmp(mf->GetSafeDefinition("CMAKE_CXX_SIMULATE_ID"), "MSVC") == 0
      );
    }
  return false;
}